

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall Alg::max_cover_lazy(Alg *this,int targetSize,int mode)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  size_t sVar2;
  iterator iVar3;
  pointer puVar4;
  pointer pvVar5;
  ulong *puVar6;
  pointer pvVar7;
  uint uVar8;
  ulong uVar9;
  ostream *poVar10;
  uint *puVar11;
  uint *puVar12;
  pointer *ppuVar13;
  long lVar14;
  ulong *puVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  value_type argmaxIdx;
  vector<bool,_std::allocator<bool>_> edgeMark;
  RRsets degMap;
  FRset coverage;
  Nodelist vecBound;
  uint local_134;
  Alg *local_130;
  allocator_type local_121;
  size_type local_120;
  uint local_118;
  int local_114;
  ulong local_110;
  vector<bool,_std::allocator<bool>_> local_108;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  long local_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  long local_90;
  long local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_68;
  long local_60;
  long local_58;
  double local_50;
  ulong local_48;
  pointer local_40;
  pointer local_38;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_118 = targetSize;
  local_114 = mode;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8,(ulong)this->__numV,(value_type_conflict2 *)&local_108,
             (allocator_type *)&local_e0);
  uVar9 = (ulong)this->__numV;
  if (uVar9 == 0) {
    uVar25 = 0;
  }
  else {
    ppuVar13 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar9 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar25 = 0;
    do {
      uVar19 = (long)*ppuVar13 - (long)((_Vector_impl_data *)(ppuVar13 + -1))->_M_start >> 3;
      if (uVar25 < uVar19) {
        uVar25 = uVar19;
      }
      ppuVar13 = ppuVar13 + -3;
      local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9 - 1] = uVar19;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_e0,uVar25 + 1,(allocator_type *)&local_108);
  uVar8 = this->__numV - 1;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar8);
  if (this->__numV != 0) {
    do {
      if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] != 0) {
        pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (local_e0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8]);
        iVar3._M_current = *(uint **)(pvVar1 + 8);
        if (iVar3._M_current == *(uint **)(pvVar1 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar3,(uint *)&local_108);
        }
        else {
          *iVar3._M_current = uVar8;
          *(uint **)(pvVar1 + 8) = iVar3._M_current + 1;
        }
      }
      bVar27 = (int)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar8 = (int)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar8);
    } while (bVar27);
  }
  local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_108,this->__numRRsets,(bool *)&local_80,(allocator_type *)&local_134);
  puVar4 = (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  bVar27 = uVar25 == 0;
  if (!bVar27) {
    local_68 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed;
    local_120 = (size_type)(int)local_118;
    local_60 = local_120 * 4 + -4;
    local_b0 = 0;
    local_130 = this;
    do {
      iVar26 = 9;
      lVar14 = (long)local_e0.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar25].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_e0.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar25].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar14 != 0) {
        local_40 = local_e0.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar25;
        lVar18 = lVar14 >> 2;
        local_48 = uVar25 - 1;
        local_90 = 1 - lVar18;
        local_88 = lVar14 + -4;
        local_110 = uVar25;
        local_58 = uVar25 * 3;
        do {
          local_134 = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar18 + -1];
          uVar9 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[local_134];
          if (uVar9 < local_110) {
            pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (local_e0.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar9);
            iVar3._M_current = *(uint **)(pvVar1 + 8);
            if (iVar3._M_current == *(uint **)(pvVar1 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar3,&local_134);
              iVar26 = 10;
            }
            else {
              *iVar3._M_current = local_134;
              *(uint **)(pvVar1 + 8) = iVar3._M_current + 1;
              iVar26 = 10;
            }
          }
          else {
            if ((local_114 == 2) ||
               ((local_114 == 1 &&
                ((long)(local_130->__vecSeed).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_130->__vecSeed).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2 == local_120)))) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_80,local_120,&local_121);
              uVar25 = (ulong)local_118;
              lVar14 = lVar18;
              if (local_118 != 0) {
                puVar4 = (&((local_e0.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start)[local_58];
                lVar20 = 0;
                do {
                  lVar14 = lVar20;
                  if (lVar18 + lVar14 == 0) {
                    uVar25 = local_120 + lVar14;
                    goto LAB_0010522e;
                  }
                  *(int *)(CONCAT71(local_80.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._1_7_,
                                    local_80.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_1_) + local_60 +
                          lVar14 * 4) =
                       (int)local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [*(uint *)((long)puVar4 + lVar14 * 4 + local_88)];
                  lVar20 = lVar14 + -1;
                } while (local_120 + lVar14 + -1 != 0);
                uVar25 = 0;
LAB_0010522e:
                lVar14 = lVar14 - local_90;
              }
              bVar29 = (int)uVar25 == 0;
              uVar19 = local_110;
              if (!bVar29) {
                uVar19 = local_48;
                if (local_48 == 0) {
                  uVar19 = 0;
                }
                else {
                  do {
                    puVar4 = local_e0.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar19].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                    lVar20 = (long)puVar4 -
                             (long)local_e0.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2;
                    lVar21 = (long)(int)uVar25;
                    lVar14 = 0;
                    do {
                      lVar16 = lVar14;
                      if (lVar20 + lVar16 == 0) {
                        uVar25 = lVar21 + lVar16;
                        goto LAB_001052b4;
                      }
                      *(int *)(CONCAT71(local_80.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        local_80.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                               lVar21 * 4 + -4 + lVar16 * 4) =
                           (int)local_c8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[puVar4[lVar16 + -1]];
                      lVar14 = lVar16 + -1;
                    } while (lVar21 + lVar16 + -1 != 0);
                    uVar25 = 0;
LAB_001052b4:
                    bVar29 = (int)uVar25 == 0;
                    if (bVar29) goto LAB_001052c2;
                    uVar19 = uVar19 - 1;
                  } while (uVar19 != 0);
                  uVar19 = 0;
LAB_001052c2:
                  lVar14 = lVar16 + lVar20 + -1;
                }
              }
              puVar12 = (uint *)CONCAT71(local_80.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_80.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
              uVar25 = (long)local_80.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar12 >> 2;
              if ((1 < uVar25) && (1 < uVar25 + 1)) {
                uVar22 = uVar25 + 1 >> 1;
                do {
                  uVar23 = uVar22 - 1;
                  uVar8 = puVar12[uVar22 - 1];
                  uVar17 = uVar22 * 2 - 1;
                  uVar24 = uVar23;
                  if (uVar17 < uVar25) {
                    lVar20 = uVar22 * 2 + -2;
                    do {
                      if ((lVar20 + 2U == uVar25) ||
                         (uVar22 = lVar20 + 2U, puVar12[uVar17] < puVar12[lVar20 + 2])) {
                        uVar22 = uVar17;
                      }
                      if (uVar8 <= puVar12[uVar22]) break;
                      puVar12[uVar24] = puVar12[uVar22];
                      lVar20 = uVar22 * 2;
                      uVar17 = uVar22 * 2 + 1;
                      uVar24 = uVar22;
                    } while (uVar17 < uVar25);
                  }
                  puVar12[uVar24] = uVar8;
                  uVar22 = uVar23;
                } while (uVar23 != 0);
              }
              if (bVar29) {
                do {
                  bVar28 = lVar14 == 0;
                  lVar14 = lVar14 + -1;
                  if (bVar28) break;
                  if (*puVar12 < uVar19) {
                    uVar22 = local_c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [local_e0.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar14]];
                    if (*puVar12 < uVar22) {
                      if (uVar25 < 2) {
                        uVar17 = 0;
                      }
                      else {
                        uVar24 = 1;
                        lVar20 = 0;
                        uVar17 = 0;
                        do {
                          if ((lVar20 + 2U == uVar25) ||
                             (uVar23 = lVar20 + 2U, puVar12[uVar24] < puVar12[lVar20 + 2])) {
                            uVar23 = uVar24;
                          }
                          if (uVar22 <= puVar12[uVar23]) break;
                          puVar12[uVar17] = puVar12[uVar23];
                          lVar20 = uVar23 * 2;
                          uVar24 = uVar23 * 2 + 1;
                          uVar17 = uVar23;
                        } while (uVar24 < uVar25);
                      }
                      puVar12[uVar17] = (uint)uVar22;
                    }
                  }
                  else {
                    bVar29 = false;
                  }
                } while (bVar29);
              }
              if (bVar29) {
                local_38 = local_e0.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar19 = uVar19 - 1;
                  if (uVar19 == 0) break;
                  if (bVar29) {
                    puVar4 = local_e0.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar19].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    lVar14 = (long)local_e0.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
                    do {
                      bVar28 = lVar14 == 0;
                      lVar14 = lVar14 + -1;
                      if (bVar28) break;
                      if (*puVar12 < uVar19) {
                        uVar22 = local_c8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[puVar4[lVar14]];
                        if (*puVar12 < uVar22) {
                          if (uVar25 < 2) {
                            uVar17 = 0;
                          }
                          else {
                            uVar24 = 1;
                            lVar20 = 0;
                            uVar17 = 0;
                            do {
                              if ((lVar20 + 2U == uVar25) ||
                                 (uVar23 = lVar20 + 2U, puVar12[uVar24] < puVar12[lVar20 + 2])) {
                                uVar23 = uVar24;
                              }
                              if (uVar22 <= puVar12[uVar23]) break;
                              puVar12[uVar17] = puVar12[uVar23];
                              lVar20 = uVar23 * 2;
                              uVar24 = uVar23 * 2 + 1;
                              uVar17 = uVar23;
                            } while (uVar24 < uVar25);
                          }
                          puVar12[uVar17] = (uint)uVar22;
                        }
                      }
                      else {
                        bVar29 = false;
                      }
                    } while (bVar29);
                  }
                } while (bVar29);
              }
              lVar14 = 0;
              for (puVar11 = puVar12;
                  puVar11 !=
                  local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
                lVar14 = lVar14 + (ulong)*puVar11;
              }
              lVar14 = lVar14 + local_b0;
              auVar31._8_4_ = (int)((ulong)lVar14 >> 0x20);
              auVar31._0_8_ = lVar14;
              auVar31._12_4_ = 0x45300000;
              sVar2 = local_130->__numRRsets;
              auVar32._8_4_ = (int)(sVar2 >> 0x20);
              auVar32._0_8_ = sVar2;
              auVar32._12_4_ = 0x45300000;
              dVar30 = ((double)local_130->__numV *
                       ((auVar31._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0))) /
                       ((auVar32._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
              local_130->__boundLast = dVar30;
              if (dVar30 < local_130->__boundMin) {
                local_130->__boundMin = dVar30;
              }
              local_a8 = uVar9;
              if (puVar12 != (uint *)0x0) {
                operator_delete(puVar12,(long)local_80.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)puVar12);
              }
            }
            iVar3._M_current =
                 (local_130->__vecSeed).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if ((ulong)((long)iVar3._M_current -
                        (long)(local_130->__vecSeed).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) < local_120) {
              if (iVar3._M_current ==
                  (local_130->__vecSeed).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_68,iVar3,&local_134);
              }
              else {
                *iVar3._M_current = local_134;
                (local_130->__vecSeed).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              local_b0 = local_b0 + uVar9;
              uVar9 = (ulong)local_134;
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] = 0;
              pvVar5 = (local_130->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar15 = pvVar5[uVar9].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar6 = *(pointer *)
                        ((long)&pvVar5[uVar9].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data + 8);
              iVar26 = 0;
              if (puVar15 != puVar6) {
                pvVar7 = (local_130->__hyperG)._RRsets.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar9 = *puVar15;
                  uVar25 = uVar9 + 0x3f;
                  if (-1 < (long)uVar9) {
                    uVar25 = uVar9;
                  }
                  uVar19 = (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001);
                  if ((local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar25 >> 6) + (uVar19 - 1)] >> (uVar9 & 0x3f) & 1) == 0) {
                    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar25 >> 6) + (uVar19 - 1)] =
                         local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar25 >> 6) + (uVar19 - 1)] | 1L << ((byte)uVar9 & 0x3f);
                    puVar11 = *(pointer *)
                               ((long)&pvVar7[uVar9].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8);
                    for (puVar12 = pvVar7[uVar9].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; puVar12 != puVar11;
                        puVar12 = puVar12 + 1) {
                      if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar12] != 0) {
                        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar12] =
                             local_c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[*puVar12] - 1;
                      }
                    }
                  }
                  puVar15 = puVar15 + 1;
                  iVar26 = 0;
                } while (puVar15 != puVar6);
              }
            }
            else {
              uVar8 = local_130->__numV;
              local_a8 = local_130->__numRRsets;
              uStack_a0 = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
              auVar33._8_4_ = (int)((ulong)local_b0 >> 0x20);
              auVar33._0_8_ = local_b0;
              auVar33._12_4_ = 0x45300000;
              auVar34._8_4_ = (int)(local_a8 >> 0x20);
              auVar34._0_8_ = local_a8;
              auVar34._12_4_ = 0x45300000;
              local_50 = ((double)uVar8 *
                         ((auVar33._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)local_b0) - 4503599627370496.0))) /
                         ((auVar34._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0));
              poVar10 = std::ostream::_M_insert<double>(local_50);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", min-bound: ",0xd);
              poVar10 = std::ostream::_M_insert<double>(local_130->__boundMin);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", last-bound: ",0xe);
              poVar10 = std::ostream::_M_insert<double>(local_130->__boundLast);
              local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_80,1);
              iVar26 = 1;
            }
          }
          this = local_130;
          uVar25 = local_110;
          if ((iVar26 != 10) && (iVar26 != 0)) goto LAB_0010582b;
          lVar18 = lVar18 + -1;
          local_90 = local_90 + 1;
          local_88 = local_88 + -4;
        } while (lVar18 != 0);
        iVar26 = 9;
      }
LAB_0010582b:
      pvVar7 = local_e0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar26 == 9) {
        puVar4 = local_e0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar26 = 0;
        pvVar7 = local_e0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        if (puVar4 != (pointer)0x0) {
          pvVar7 = local_e0.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
          local_e0.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_e0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          operator_delete(puVar4,(long)(pvVar7->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar4);
          pvVar7 = local_e0.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      local_e0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar7;
      if (iVar26 != 0) break;
      uVar25 = uVar25 - 1;
      bVar27 = uVar25 == 0;
    } while (!bVar27);
  }
  uVar8 = this->__numV;
  if (local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_e0);
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar27) {
    local_50 = (double)uVar8;
  }
  return local_50;
}

Assistant:

double Alg::max_cover_lazy(const int targetSize, const int mode)
{
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    size_t sumInf = 0;

    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);

    __vecSeed.clear();
    for (auto deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        auto& vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;)
        {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (mode == 2 || (mode == 1 && __vecSeed.size() == targetSize))
            {
                // Find upper bound
                auto topk = targetSize;
                auto degBound = deg;
                Nodelist vecBound(targetSize);
                // Initialize vecBound
                auto idxBound = idx + 1;
                while (topk && idxBound--)
                {
                    vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                }
                while (topk && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (topk && idxBound--)
                    {
                        vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                    }
                }
                make_min_heap(vecBound);

                // Find the top-k marginal coverage
                auto flag = topk == 0;
                while (flag && idxBound--)
                {
                    const auto currDegBound = coverage[degMap[degBound][idxBound]];
                    if (vecBound[0] >= degBound)
                    {
                        flag = false;
                    }
                    else if (vecBound[0] < currDegBound)
                    {
                        min_heap_replace_min_value(vecBound, currDegBound);
                    }
                }
                while (flag && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (flag && idxBound--)
                    {
                        const auto currDegBound = coverage[degMap[degBound][idxBound]];
                        if (vecBound[0] >= degBound)
                        {
                            flag = false;
                        }
                        else if (vecBound[0] < currDegBound)
                        {
                            min_heap_replace_min_value(vecBound, currDegBound);
                        }
                    }
                }
                __boundLast = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0)) + sumInf) *
                        __numV / __numRRsets;
                if (__boundMin > __boundLast) __boundMin = __boundLast;
            }
            if (__vecSeed.size() >= targetSize)
            {
                // Top-k influential nodes constructed
                const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
                std::cout << "  >>>[greedy-lazy] influence: " << finalInf << ", min-bound: " << __boundMin <<
                          ", last-bound: " << __boundLast << '\n';
                return finalInf;
            }
            sumInf = sumInf + currDeg;
            __vecSeed.push_back(argmaxIdx);
            coverage[argmaxIdx] = 0;
            for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
            {
                if (edgeMark[edgeIdx]) continue;
                edgeMark[edgeIdx] = true;
                for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                {
                    if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                    coverage[nodeIdx]--;
                }
            }
        }
        degMap.pop_back();
    }
    return 1.0 * __numV; // All RR sets are covered.
}